

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.h
# Opt level: O1

void __thiscall
btGeneric6DofSpring2Constraint::setAngularUpperLimit
          (btGeneric6DofSpring2Constraint *this,btVector3 *angularUpper)

{
  btScalar *pbVar1;
  long lVar2;
  btScalar bVar3;
  
  pbVar1 = &this->m_angularLimits[0].m_hiLimit;
  lVar2 = 0;
  do {
    bVar3 = fmodf(angularUpper->m_floats[lVar2],6.2831855);
    if (-3.1415927 <= bVar3) {
      if (3.1415927 < bVar3) {
        bVar3 = bVar3 + -6.2831855;
      }
    }
    else {
      bVar3 = bVar3 + 6.2831855;
    }
    *pbVar1 = bVar3;
    lVar2 = lVar2 + 1;
    pbVar1 = pbVar1 + 0x16;
  } while (lVar2 != 3);
  return;
}

Assistant:

void setAngularUpperLimit(const btVector3& angularUpper)
	{
		for(int i = 0; i < 3; i++)
			m_angularLimits[i].m_hiLimit = btNormalizeAngle(angularUpper[i]);
	}